

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat3x2.c
# Opt level: O0

void glmc_mat3x2_make(float *src,vec2 *dest)

{
  vec2 *dest_local;
  float *src_local;
  
  (*dest)[0] = *src;
  (*dest)[1] = src[1];
  dest[1][0] = src[2];
  dest[1][1] = src[3];
  dest[2][0] = src[4];
  dest[2][1] = src[5];
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_mat3x2_make(const float * __restrict src, mat3x2 dest) {
  glm_mat3x2_make(src, dest);
}